

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O3

void __thiscall
midi_container::serialize_as_stream
          (midi_container *this,unsigned_long subsong,
          vector<midi_stream_event,_std::allocator<midi_stream_event>_> *p_stream,
          system_exclusive_table *p_system_exclusive,unsigned_long *loop_start,
          unsigned_long *loop_end,uint clean_flags)

{
  byte *pbVar1;
  char cVar2;
  pointer pmVar3;
  ulong uVar4;
  pointer pvVar5;
  char *pcVar6;
  pointer pcVar7;
  size_type sVar8;
  pointer puVar9;
  pointer puVar10;
  int iVar11;
  pointer *ppmVar12;
  unsigned_long uVar13;
  ulong uVar14;
  unsigned_long p_subsong;
  ulong __new_size;
  byte bVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  unsigned_long uVar19;
  ulong uVar20;
  byte *pbVar21;
  size_type __new_size_00;
  iterator __position;
  uint uVar22;
  uchar uVar23;
  size_type sVar24;
  long lVar25;
  undefined8 *puVar26;
  long lVar27;
  size_t sVar28;
  long lVar29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> port_numbers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  device_names;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_long,_std::allocator<unsigned_long>_> track_positions;
  midi_stream_event local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  ulong local_e0;
  vector<midi_stream_event,_std::allocator<midi_stream_event>_> *local_d8;
  unsigned_long local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  byte *local_b0;
  pointer local_a8;
  pointer local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  unsigned_long local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long local_60;
  system_exclusive_table *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_a8 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
  __new_size = ((long)local_a0 - (long)local_a8 >> 3) * -0x5555555555555555;
  uVar19 = 0;
  if (this->m_form == 2) {
    uVar19 = subsong;
  }
  local_38 = (this->m_timestamp_loop_start).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19];
  local_40 = (this->m_timestamp_loop_end).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19];
  local_108.m_timestamp = 0;
  local_d8 = p_stream;
  local_58 = p_system_exclusive;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_78,__new_size,&local_108.m_timestamp);
  local_108.m_timestamp = local_108.m_timestamp & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_f8,__new_size,(value_type *)&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&local_c8,__new_size);
  if (local_a0 != local_a8 && (clean_flags & 1) != 0) {
    pmVar3 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    do {
      lVar25 = *(long *)&pmVar3[uVar14].m_events.
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
      lVar17 = (long)*(pointer *)
                      ((long)&pmVar3[uVar14].m_events.
                              super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl +
                      8) - lVar25;
      if (lVar17 != 0) {
        uVar18 = lVar17 >> 6;
        uVar22 = 1;
        uVar20 = 0;
        do {
          lVar17 = uVar20 * 0x40;
          if ((((*(int *)(lVar25 + 8 + lVar17) == 3) && (*(char *)(lVar25 + 0x18 + lVar17) == 'n'))
              && (bVar15 = *(byte *)(lVar17 + lVar25 + 0x19), 1 < bVar15)) && (bVar15 != 0x7f)) {
            local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] = uVar18;
            break;
          }
          uVar20 = (ulong)uVar22;
          uVar22 = uVar22 + 1;
        } while (uVar20 < uVar18);
      }
      uVar14 = uVar14 + 1;
    } while ((uVar14 & 0xffffffff) <= __new_size && __new_size - (uVar14 & 0xffffffff) != 0);
  }
  if (this->m_form == 2 && local_a0 != local_a8) {
    ppmVar12 = (pointer *)
               ((long)&(((this->m_tracks).
                         super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
                         super__Vector_impl_data._M_start)->m_events).
                       super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8);
    uVar19 = 0;
    do {
      if (subsong != uVar19) {
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar19] =
             (long)*ppmVar12 - (long)((_Vector_impl_data *)(ppmVar12 + -1))->_M_start >> 6;
      }
      uVar19 = uVar19 + 1;
      ppmVar12 = ppmVar12 + 3;
    } while (__new_size + (__new_size == 0) != uVar19);
  }
  local_50 = loop_start;
  local_48 = loop_end;
  if (local_a0 == local_a8) {
    local_d0 = 0xffffffffffffffff;
    uVar19 = 0xffffffffffffffff;
  }
  else {
    uVar19 = 0xffffffffffffffff;
    local_d0 = 0xffffffffffffffff;
    do {
      ppmVar12 = (pointer *)
                 ((long)&(((this->m_tracks).
                           super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
                           super__Vector_impl_data._M_start)->m_events).
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8);
      uVar20 = 0;
      uVar14 = 0xffffffffffffffff;
      uVar18 = 0;
      do {
        if ((local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20] <
             (ulong)((long)*ppmVar12 - (long)((_Vector_impl_data *)(ppmVar12 + -1))->_M_start >> 6))
           && (uVar4 = ((_Vector_impl_data *)(ppmVar12 + -1))->_M_start
                       [local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar20]].m_timestamp,
              uVar4 < uVar14)) {
          uVar14 = uVar4;
          uVar18 = uVar20;
        }
        uVar20 = uVar20 + 1;
        ppmVar12 = ppmVar12 + 3;
      } while ((uVar20 & 0xffffffff) <= __new_size && __new_size - (uVar20 & 0xffffffff) != 0);
      if (uVar14 == 0xffffffffffffffff) break;
      pmVar3 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((clean_flags & 6) == 0) {
        uVar13 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18];
        lVar25 = *(long *)&pmVar3[uVar18].m_events.
                           super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
LAB_0010583e:
        p_subsong = 0;
        if (this->m_form == 2) {
          p_subsong = subsong;
        }
        uVar14 = *(ulong *)(lVar25 + uVar13 * 0x40);
        if ((uVar19 == 0xffffffffffffffff) && (uVar19 = 0xffffffffffffffff, local_38 <= uVar14)) {
          uVar19 = *(long *)(local_d8 + 8) - *(long *)local_d8 >> 4;
        }
        if ((local_d0 == 0xffffffffffffffff) && (local_d0 = 0xffffffffffffffff, local_40 < uVar14))
        {
          local_d0 = *(long *)(local_d8 + 8) - *(long *)local_d8 >> 4;
        }
        lVar25 = lVar25 + uVar13 * 0x40;
        local_80 = timestamp_to_ms(this,uVar14,p_subsong);
        if (*(int *)(lVar25 + 8) == 7) {
          uVar14 = (*(long *)(lVar25 + 0x10) + *(long *)(lVar25 + 0x30)) - *(long *)(lVar25 + 0x28);
          local_b0 = (byte *)(lVar25 + 0x18);
          bVar15 = *(byte *)(lVar25 + 0x18);
          if (bVar15 == 0xf0 && 2 < uVar14) {
            lVar17 = uVar18 * 0x20;
            local_e0 = uVar14;
            if (local_c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length != 0) {
              pvVar5 = (this->m_device_names).
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar26 = *(undefined8 **)
                         &pvVar5[*(uint *)(lVar25 + 0xc)].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
              lVar27 = (long)*(pointer *)
                              ((long)&pvVar5[*(uint *)(lVar25 + 0xc)].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - (long)puVar26;
              if (lVar27 == 0) {
                uVar23 = '\0';
              }
              else {
                lVar27 = lVar27 >> 5;
                pcVar6 = local_c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p;
                lVar27 = lVar27 + (ulong)(lVar27 == 0);
                lVar29 = 0;
                local_60 = lVar17;
                do {
                  iVar11 = strcmp((char *)*puVar26,pcVar6);
                  lVar17 = lVar29;
                  if (iVar11 == 0) break;
                  lVar29 = lVar29 + 1;
                  puVar26 = puVar26 + 4;
                  lVar17 = lVar27;
                } while (lVar27 != lVar29);
                uVar23 = (uchar)lVar17;
                lVar17 = local_60;
              }
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18] = uVar23;
              *(undefined8 *)
               ((long)&(local_c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar17) = 0;
              **(undefined1 **)
                ((long)&((local_c8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17) =
                   0;
              puVar9 = (this->m_port_numbers).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar10 = (this->m_port_numbers).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (puVar10 != puVar9) {
                uVar14 = 0;
                do {
                  if (puVar9[uVar14] ==
                      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar18]) {
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar18] = (uchar)uVar14;
                    break;
                  }
                  uVar14 = (ulong)((int)uVar14 + 1);
                } while (uVar14 < (ulong)((long)puVar10 - (long)puVar9));
              }
            }
            uVar14 = local_e0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_98,local_e0);
            puVar9 = local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar20 = (*(long *)(lVar25 + 0x10) + *(long *)(lVar25 + 0x30)) -
                     *(long *)(lVar25 + 0x28);
            if (uVar14 <= uVar20) {
              uVar20 = uVar14;
            }
            sVar28 = 0x10;
            if (uVar20 < 0x10) {
              sVar28 = uVar20;
            }
            memcpy(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,local_b0,sVar28);
            if (0x10 < uVar20) {
              memcpy(puVar9 + sVar28,*(void **)(lVar25 + 0x28),uVar20 - sVar28);
            }
            if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[local_e0 - 1] == 0xf7) {
              local_108.m_event =
                   system_exclusive_table::add_entry
                             (local_58,local_98.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,local_e0,
                              (ulong)local_f8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar18]);
              local_108.m_event = local_108.m_event | 0x80000000;
              local_108.m_timestamp = local_80;
              __position._M_current = *(midi_stream_event **)(local_d8 + 8);
              if (__position._M_current != *(midi_stream_event **)(local_d8 + 0x10))
              goto LAB_00105cdc;
              std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
              _M_realloc_insert<midi_stream_event>(local_d8,__position,&local_108);
            }
          }
          else if (bVar15 == 0xff && 2 < uVar14) {
            cVar2 = *(char *)(lVar25 + 0x19);
            if (cVar2 == '\x04') {
LAB_00105a7e:
              __new_size_00 = uVar14 - 2;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_98,__new_size_00);
              puVar9 = local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar14 = ((*(long *)(lVar25 + 0x10) + *(long *)(lVar25 + 0x30)) -
                       *(long *)(lVar25 + 0x28)) - 2;
              if (__new_size_00 <= uVar14) {
                uVar14 = __new_size_00;
              }
              sVar28 = 0xe;
              if (uVar14 < 0xe) {
                sVar28 = uVar14;
              }
              local_e0 = __new_size_00;
              memcpy(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(void *)(lVar25 + 0x1a),sVar28);
              if (0xe < uVar14) {
                memcpy(puVar9 + sVar28,*(void **)(lVar25 + 0x28),uVar14 - sVar28);
              }
              local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length = 0;
              *local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p = '\0';
              pcVar7 = local_c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p;
              std::__cxx11::string::
              _M_replace_dispatch<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((string *)
                         (local_c8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar18),pcVar7,
                         pcVar7 + local_c8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length
                         ,local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                         local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + local_e0);
              sVar8 = local_c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length;
              if (sVar8 != 0) {
                pcVar7 = local_c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p;
                sVar24 = 0;
                do {
                  iVar11 = tolower((int)pcVar7[sVar24]);
                  pcVar7[sVar24] = (char)iVar11;
                  sVar24 = sVar24 + 1;
                } while (sVar8 != sVar24);
              }
            }
            else if (cVar2 == '!') {
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18] = *(uchar *)(lVar25 + 0x1a);
              local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length = 0;
              *local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p = '\0';
              puVar9 = (this->m_port_numbers).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar10 = (this->m_port_numbers).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (puVar10 != puVar9) {
                uVar14 = 0;
                do {
                  if (puVar9[uVar14] ==
                      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar18]) {
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar18] = (uchar)uVar14;
                    break;
                  }
                  uVar14 = (ulong)((int)uVar14 + 1);
                } while (uVar14 < (ulong)((long)puVar10 - (long)puVar9));
              }
            }
            else if (cVar2 == '\t') goto LAB_00105a7e;
          }
          else if (0xf7 < bVar15 && uVar14 == 1) {
            if (local_c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length != 0) {
              pvVar5 = (this->m_device_names).
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar26 = *(undefined8 **)
                         &pvVar5[*(uint *)(lVar25 + 0xc)].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
              lVar25 = (long)*(pointer *)
                              ((long)&pvVar5[*(uint *)(lVar25 + 0xc)].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) - (long)puVar26;
              if (lVar25 == 0) {
                uVar23 = '\0';
              }
              else {
                lVar25 = lVar25 >> 5;
                pcVar6 = local_c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p;
                lVar25 = lVar25 + (ulong)(lVar25 == 0);
                lVar17 = 0;
                do {
                  iVar11 = strcmp((char *)*puVar26,pcVar6);
                  lVar27 = lVar17;
                  if (iVar11 == 0) break;
                  lVar17 = lVar17 + 1;
                  puVar26 = puVar26 + 4;
                  lVar27 = lVar25;
                } while (lVar25 != lVar17);
                uVar23 = (uchar)lVar27;
              }
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18] = uVar23;
              local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length = 0;
              *local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p = '\0';
              puVar9 = (this->m_port_numbers).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar10 = (this->m_port_numbers).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (puVar10 != puVar9) {
                uVar14 = 0;
                do {
                  if (puVar9[uVar14] ==
                      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar18]) {
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar18] = (uchar)uVar14;
                    break;
                  }
                  uVar14 = (ulong)((int)uVar14 + 1);
                } while (uVar14 < (ulong)((long)puVar10 - (long)puVar9));
              }
            }
            local_108.m_event =
                 (uint)*local_b0 |
                 (uint)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18] << 0x18;
            local_108.m_timestamp = local_80;
            __position._M_current = *(midi_stream_event **)(local_d8 + 8);
            if (__position._M_current != *(midi_stream_event **)(local_d8 + 0x10))
            goto LAB_00105cdc;
            std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
            _M_realloc_insert<midi_stream_event>(local_d8,__position,&local_108);
          }
        }
        else {
          pbVar21 = (byte *)(uVar18 * 0x20);
          if (local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length != 0) {
            pvVar5 = (this->m_device_names).
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar26 = *(undefined8 **)
                       &pvVar5[*(uint *)(lVar25 + 0xc)].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
            lVar17 = (long)*(pointer *)
                            ((long)&pvVar5[*(uint *)(lVar25 + 0xc)].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) - (long)puVar26;
            if (lVar17 == 0) {
              uVar23 = '\0';
            }
            else {
              lVar17 = lVar17 >> 5;
              pcVar6 = local_c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p;
              lVar17 = lVar17 + (ulong)(lVar17 == 0);
              lVar27 = 0;
              local_b0 = pbVar21;
              do {
                iVar11 = strcmp((char *)*puVar26,pcVar6);
                lVar29 = lVar27;
                if (iVar11 == 0) break;
                lVar27 = lVar27 + 1;
                puVar26 = puVar26 + 4;
                lVar29 = lVar17;
              } while (lVar17 != lVar27);
              uVar23 = (uchar)lVar29;
              pbVar21 = local_b0;
            }
            local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18] = uVar23;
            pbVar1 = (byte *)((long)&(local_c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                             (long)pbVar21);
            pbVar1[0] = 0;
            pbVar1[1] = 0;
            pbVar1[2] = 0;
            pbVar1[3] = 0;
            pbVar1[4] = 0;
            pbVar1[5] = 0;
            pbVar1[6] = 0;
            pbVar1[7] = 0;
            **(undefined1 **)
              (pbVar21 +
              (long)&(local_c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus) = 0;
            puVar9 = (this->m_port_numbers).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar10 = (this->m_port_numbers).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (puVar10 != puVar9) {
              uVar14 = 0;
              do {
                if (puVar9[uVar14] ==
                    local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar18]) {
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar18] = (uchar)uVar14;
                  break;
                }
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (uVar14 < (ulong)((long)puVar10 - (long)puVar9));
            }
          }
          iVar11 = (uint)*(byte *)(lVar25 + 0x18) << 8;
          if (*(ulong *)(lVar25 + 0x10) == 0) {
            iVar11 = 0;
          }
          iVar16 = (uint)*(byte *)(lVar25 + 0x19) << 0x10;
          if (*(ulong *)(lVar25 + 0x10) < 2) {
            iVar16 = 0;
          }
          local_108.m_event =
               (uint)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar18] * 0x1000000 +
               iVar16 + iVar11 + *(int *)(lVar25 + 8) * 0x10 + *(int *)(lVar25 + 0xc) + 0x80;
          local_108.m_timestamp = local_80;
          __position._M_current = *(midi_stream_event **)(local_d8 + 8);
          if (__position._M_current == *(midi_stream_event **)(local_d8 + 0x10)) {
            std::vector<midi_stream_event,_std::allocator<midi_stream_event>_>::
            _M_realloc_insert<midi_stream_event>(local_d8,__position,&local_108);
          }
          else {
LAB_00105cdc:
            (__position._M_current)->m_timestamp = local_80;
            *(ulong *)&(__position._M_current)->m_event =
                 CONCAT44(local_108._12_4_,local_108.m_event);
            *(long *)(local_d8 + 8) = *(long *)(local_d8 + 8) + 0x10;
            local_108.m_timestamp = local_80;
          }
        }
      }
      else {
        uVar13 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18];
        lVar25 = *(long *)&pmVar3[uVar18].m_events.
                           super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        iVar11 = *(int *)(lVar25 + 8 + uVar13 * 0x40);
        bVar15 = iVar11 == 4 & (byte)clean_flags >> 1;
        if (((clean_flags & 4) == 0) || (bVar15 != 0)) {
          if (bVar15 == 0) goto LAB_0010583e;
        }
        else if ((iVar11 != 3) || ((*(byte *)(uVar13 * 0x40 + lVar25 + 0x18) & 0xdf) != 0))
        goto LAB_0010583e;
      }
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] =
           local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar18] + 1;
    } while (local_a0 != local_a8);
  }
  *local_50 = uVar19;
  *local_48 = local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void midi_container::serialize_as_stream( unsigned long subsong,
                                          std::vector<midi_stream_event> & p_stream,
                                          system_exclusive_table & p_system_exclusive,
                                          unsigned long & loop_start,
                                          unsigned long & loop_end,
                                          unsigned clean_flags ) const
{
    std::vector<uint8_t> data;
    std::vector<std::size_t> track_positions;
    std::vector<uint8_t> port_numbers;
    std::vector<std::string> device_names;
    std::size_t track_count = m_tracks.size();

    unsigned long tick_loop_start = get_timestamp_loop_start(subsong);
    unsigned long tick_loop_end = get_timestamp_loop_end(subsong);
    unsigned long local_loop_start = ~0UL;
    unsigned long local_loop_end = ~0UL;

    track_positions.resize( track_count, 0 );
    port_numbers.resize( track_count, 0 );
    device_names.resize( track_count );

    bool clean_emidi = !!( clean_flags & clean_flag_emidi );
    bool clean_instruments = !!( clean_flags & clean_flag_instruments );
    bool clean_banks = !!( clean_flags & clean_flag_banks );

    if ( clean_emidi )
    {
        for ( unsigned i = 0; i < track_count; ++i )
        {
            bool skip_track = false;
            const midi_track & track = m_tracks[ i ];
            for ( unsigned j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                     event.m_data[ 0 ] == 110 )
                {
                    if ( event.m_data[ 1 ] != 0 && event.m_data[ 1 ] != 1 && event.m_data[ 1 ] != 127 )
                    {
                        skip_track = true;
                        break;
                    }
                }
            }
            if ( skip_track )
            {
                track_positions[ i ] = track.get_count();
            }
        }
    }

    if ( m_form == 2 )
    {
        for ( unsigned long i = 0; i < track_count; ++i )
        {
            if ( i != subsong ) track_positions[ i ] = m_tracks[ i ].get_count();
        }
    }

    for (;;)
    {
        unsigned long next_timestamp = ~0UL;
        std::size_t next_track = 0;
        for ( unsigned i = 0; i < track_count; ++i )
        {
            if ( track_positions[ i ] >= m_tracks[ i ].get_count() ) continue;
            if ( m_tracks[ i ][ track_positions[ i ] ].m_timestamp < next_timestamp )
            {
                next_timestamp = m_tracks[ i ][ track_positions[ i ] ].m_timestamp;
                next_track = i;
            }
        }
        if ( next_timestamp == ~0UL ) break;

        bool filtered = false;

        if ( clean_instruments || clean_banks )
        {
            const midi_event & event = m_tracks[ next_track ][ track_positions[ next_track ] ];
            if ( clean_instruments && event.m_type == midi_event::program_change ) filtered = true;
            else if ( clean_banks && event.m_type == midi_event::control_change &&
                ( event.m_data[ 0 ] == 0x00 || event.m_data[ 0 ] == 0x20 ) ) filtered = true;
        }

        if ( !filtered )
        {
            unsigned long tempo_track = 0;
            if ( m_form == 2 && subsong ) tempo_track = subsong;

            const midi_event & event = m_tracks[ next_track ][ track_positions[ next_track ] ];

            if ( local_loop_start == ~0UL && event.m_timestamp >= tick_loop_start )
                local_loop_start = p_stream.size();
            if ( local_loop_end == ~0UL && event.m_timestamp > tick_loop_end )
                local_loop_end = p_stream.size();

            unsigned long timestamp_ms = timestamp_to_ms( event.m_timestamp, tempo_track );
            if ( event.m_type != midi_event::extended )
            {
                if ( device_names[ next_track ].length() )
                {
                    unsigned long i, j;
                    for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                    {
                        if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                    }
                    port_numbers[ next_track ] = (uint8_t) i;
                    device_names[ next_track ].clear();
                    limit_port_number( port_numbers[ next_track ] );
                }

                uint32_t event_code = ( ( event.m_type + 8 ) << 4 ) + event.m_channel;
                if ( event.m_data_count >= 1 ) event_code += event.m_data[ 0 ] << 8;
                if ( event.m_data_count >= 2 ) event_code += event.m_data[ 1 ] << 16;
                event_code += port_numbers[ next_track ] << 24;
                p_stream.push_back( midi_stream_event( timestamp_ms, event_code ) );
            }
            else
            {
                std::size_t data_count = event.get_data_count();
                if ( data_count >= 3 && event.m_data[ 0 ] == 0xF0 )
                {
                    if ( device_names[ next_track ].length() )
                    {
                        unsigned long i, j;
                        for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                        {
                            if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                        }
                        port_numbers[ next_track ] = (uint8_t) i;
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }

                    data.resize( data_count );
                    event.copy_data( &data[0], 0, data_count );
                    if ( data[ data_count - 1 ] == 0xF7 )
                    {
                        uint32_t system_exclusive_index = p_system_exclusive.add_entry( &data[0], data_count, port_numbers[ next_track ] );
                        p_stream.push_back( midi_stream_event( timestamp_ms, system_exclusive_index | 0x80000000 ) );
                    }
                }
                else if ( data_count >= 3 && event.m_data[ 0 ] == 0xFF )
                {
                    if ( event.m_data[ 1 ] == 4 || event.m_data[ 1 ] == 9 )
                    {
                        unsigned long _data_count = event.get_data_count() - 2;
                        data.resize( _data_count );
                        event.copy_data( &data[0], 2, _data_count );
                        device_names[ next_track ].clear();
                        device_names[ next_track ].assign( data.begin(), data.begin() + _data_count );
                        std::transform( device_names[ next_track ].begin(), device_names[ next_track ].end(), device_names[ next_track ].begin(), ::tolower );
                    }
                    else if ( event.m_data[ 1 ] == 0x21 )
                    {
                        port_numbers[ next_track ] = event.m_data[ 2 ];
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }
                }
                else if ( data_count == 1 && event.m_data[ 0 ] >= 0xF8 )
                {
                    if ( device_names[ next_track ].length() )
                    {
                        unsigned long i, j;
                        for ( i = 0, j = m_device_names[ event.m_channel ].size(); i < j; ++i )
                        {
                            if ( !strcmp( m_device_names[ event.m_channel ][ i ].c_str(), device_names[ next_track ].c_str() ) ) break;
                        }
                        port_numbers[ next_track ] = (uint8_t) i;
                        device_names[ next_track ].clear();
                        limit_port_number( port_numbers[ next_track ] );
                    }

                    uint32_t event_code = port_numbers[ next_track ] << 24;
                    event_code += event.m_data[ 0 ];
                    p_stream.push_back( midi_stream_event( timestamp_ms, event_code ) );
                }
            }
        }

        track_positions[ next_track ]++;
    }

    loop_start = local_loop_start;
    loop_end = local_loop_end;
}